

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void lua_rawseti(lua_State *L,int idx,lua_Integer n)

{
  TValue *pTVar1;
  StkId o;
  lua_Integer n_local;
  int idx_local;
  lua_State *L_local;
  
  pTVar1 = index2addr(L,idx);
  luaH_setint(L,(Table *)(pTVar1->value_).gc,n,L->top + -1);
  if ((((L->top[-1].tt_ & 0x40U) != 0) && ((((pTVar1->value_).gc)->marked & 4) != 0)) &&
     (((L->top[-1].value_.gc)->marked & 3) != 0)) {
    luaC_barrierback_(L,(Table *)(pTVar1->value_).gc);
  }
  L->top = L->top + -1;
  return;
}

Assistant:

LUA_API void lua_rawseti (lua_State *L, int idx, lua_Integer n) {
  StkId o;
  lua_lock(L);
  api_checknelems(L, 1);
  o = index2addr(L, idx);
  api_check(L, ttistable(o), "table expected");
  luaH_setint(L, hvalue(o), n, L->top - 1);
  luaC_barrierback(L, hvalue(o), L->top-1);
  L->top--;
  lua_unlock(L);
}